

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequencer.c
# Opt level: O1

int lws_seq_check_wsi(lws_seq_t *seq,lws *wsi)

{
  lws_dll2 *plVar1;
  
  for (plVar1 = (seq->seq_event_owner).head;
      (plVar1 != (lws_dll2 *)0x0 &&
      ((*(int *)&plVar1[1].owner != 6 || ((lws *)plVar1[1].prev != wsi)))); plVar1 = plVar1->next) {
  }
  return (uint)(plVar1 != (lws_dll2 *)0x0);
}

Assistant:

int
lws_seq_check_wsi(lws_seq_t *seq, struct lws *wsi)
{
	lws_seq_event_t *seqe;
	struct lws_dll2 *dh;

	lws_pt_lock(seq->pt, __func__); /* ----------------------------- pt { */

	dh = lws_dll2_get_head(&seq->seq_event_owner);
	while (dh) {
		seqe = lws_container_of(dh, lws_seq_event_t, seq_event_list);

		if (seqe->e == LWSSEQ_WSI_CONN_CLOSE && seqe->data == wsi)
			break;

		dh = dh->next;
	}

	lws_pt_unlock(seq->pt); /* } pt ------------------------------------- */

	return !!dh;
}